

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O3

void __thiscall
polyscope::render::backend_openGL_mock::GLShaderProgram::setAttribute
          (GLShaderProgram *this,string *name,
          shared_ptr<polyscope::render::AttributeBuffer> *externalBuffer)

{
  pointer pGVar1;
  size_t __n;
  element_type *peVar2;
  int iVar3;
  invalid_argument *piVar4;
  long *plVar5;
  size_type *psVar6;
  polyscope *this_00;
  pointer pGVar7;
  GLShaderProgram *this_01;
  shared_ptr<polyscope::render::backend_openGL_mock::GLAttributeBuffer> engineExtBuff;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  RenderDataType local_b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  pGVar7 = (this->attributes).
           super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pGVar1 = (this->attributes).
           super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pGVar7 != pGVar1) {
    __n = name->_M_string_length;
    this_00 = (polyscope *)&pGVar7->type;
    do {
      if (*(size_t *)(this_00 + -0x18) == __n) {
        if (__n != 0) {
          iVar3 = bcmp(*(void **)(this_00 + -0x20),(name->_M_dataplus)._M_p,__n);
          if (iVar3 != 0) goto LAB_00295042;
        }
        iVar3 = renderDataTypeCountCompatbility
                          (*(RenderDataType *)this_00,
                           ((externalBuffer->
                            super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr)->dataType);
        if (iVar3 == 0) {
          piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::operator+(&local_90,"Tried to set attribute ",name);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
          psVar6 = (size_type *)(plVar5 + 2);
          local_b0._M_dataplus._M_p = (pointer)*plVar5;
          if ((size_type *)local_b0._M_dataplus._M_p == psVar6) {
            local_b0.field_2._M_allocated_capacity = *psVar6;
            local_b0.field_2._8_8_ = plVar5[3];
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          }
          else {
            local_b0.field_2._M_allocated_capacity = *psVar6;
          }
          local_b0._M_string_length = plVar5[1];
          *plVar5 = (long)psVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          renderDataTypeName_abi_cxx11_
                    (&local_50,this_00,(RenderDataType *)local_b0._M_string_length);
          std::operator+(&local_d8,&local_b0,&local_50);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
          psVar6 = (size_type *)(plVar5 + 2);
          local_f8._M_dataplus._M_p = (pointer)*plVar5;
          if ((size_type *)local_f8._M_dataplus._M_p == psVar6) {
            local_f8.field_2._M_allocated_capacity = *psVar6;
            local_f8.field_2._8_8_ = plVar5[3];
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          }
          else {
            local_f8.field_2._M_allocated_capacity = *psVar6;
          }
          local_f8._M_string_length = plVar5[1];
          *plVar5 = (long)psVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          local_b4 = ((externalBuffer->
                      super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->dataType;
          renderDataTypeName_abi_cxx11_
                    (&local_70,(polyscope *)&local_b4,(RenderDataType *)local_f8._M_string_length);
          std::operator+(&local_118,&local_f8,&local_70);
          std::invalid_argument::invalid_argument(piVar4,(string *)&local_118);
          __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        if (*(long *)(this_00 + 8) != 0) {
          piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::operator+(&local_f8,"attribute ",name);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
          psVar6 = (size_type *)(plVar5 + 2);
          local_118._M_dataplus._M_p = (pointer)*plVar5;
          if ((size_type *)local_118._M_dataplus._M_p == psVar6) {
            local_118.field_2._M_allocated_capacity = *psVar6;
            local_118.field_2._8_8_ = plVar5[3];
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          }
          else {
            local_118.field_2._M_allocated_capacity = *psVar6;
          }
          local_118._M_string_length = plVar5[1];
          *plVar5 = (long)psVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::invalid_argument::invalid_argument(piVar4,(string *)&local_118);
          __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        peVar2 = (externalBuffer->
                 super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>)
                 ._M_ptr;
        if (peVar2 != (element_type *)0x0) {
          local_d8._M_dataplus._M_p =
               (pointer)__dynamic_cast(peVar2,&AttributeBuffer::typeinfo,
                                       &GLAttributeBuffer::typeinfo,0);
          if (local_d8._M_dataplus._M_p != (pointer)0x0) {
            local_d8._M_string_length =
                 (size_type)
                 (externalBuffer->
                 super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>)
                 ._M_refcount._M_pi;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00295115:
              *(pointer *)(this_00 + 8) = local_d8._M_dataplus._M_p;
              this_01 = (GLShaderProgram *)(this_00 + 0x10);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_01,
                         (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d8._M_string_length);
              assignBufferToVAO(this_01,(GLShaderAttribute *)(this_00 + -0x20));
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length
                          );
              }
              return;
            }
            if (__libc_single_threaded != '\0') {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length)->
              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_d8._M_string_length)->_M_use_count + 1;
              goto LAB_00295115;
            }
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length)->
            _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_d8._M_string_length)->_M_use_count + 1;
            UNLOCK();
            if (local_d8._M_dataplus._M_p != (pointer)0x0) goto LAB_00295115;
            goto LAB_00295161;
          }
        }
        local_d8._M_dataplus._M_p = (pointer)0x0;
        local_d8._M_string_length = 0;
LAB_00295161:
        piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::operator+(&local_f8,"attribute ",name);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
        psVar6 = (size_type *)(plVar5 + 2);
        local_118._M_dataplus._M_p = (pointer)*plVar5;
        if ((size_type *)local_118._M_dataplus._M_p == psVar6) {
          local_118.field_2._M_allocated_capacity = *psVar6;
          local_118.field_2._8_8_ = plVar5[3];
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        }
        else {
          local_118.field_2._M_allocated_capacity = *psVar6;
        }
        local_118._M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::invalid_argument::invalid_argument(piVar4,(string *)&local_118);
        __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
LAB_00295042:
      pGVar7 = (pointer)(this_00 + 0x18);
      this_00 = this_00 + 0x38;
    } while (pGVar7 != pGVar1);
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_118,"Tried to set nonexistent attribute with name ",name);
  std::invalid_argument::invalid_argument(piVar4,(string *)&local_118);
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void GLShaderProgram::setAttribute(std::string name, std::shared_ptr<AttributeBuffer> externalBuffer) {
  bindVAO();
  checkGLError();

  for (GLShaderAttribute& a : attributes) {
    if (a.name == name) {

      // check that types match
      int compatCount = renderDataTypeCountCompatbility(a.type, externalBuffer->getType());
      if (compatCount == 0)
        throw std::invalid_argument("Tried to set attribute " + name + " to incompatibile type. Attribute " +
                                    renderDataTypeName(a.type) + " set with buffer of type " +
                                    renderDataTypeName(externalBuffer->getType()));

      // check multiple-set errors (duplicates in externalBuffers list?)
      if (a.buff) throw std::invalid_argument("attribute " + name + " is already set");

      // cast to the engine type (booooooo)
      std::shared_ptr<GLAttributeBuffer> engineExtBuff = std::dynamic_pointer_cast<GLAttributeBuffer>(externalBuffer);
      if (!engineExtBuff) throw std::invalid_argument("attribute " + name + " external buffer engine type cast failed");

      a.buff = engineExtBuff;

      a.buff->bind();

      assignBufferToVAO(a);
      return;
    }
  }

  throw std::invalid_argument("Tried to set nonexistent attribute with name " + name);
}